

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_setupresult(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  byte bVar1;
  int ofs_00;
  long in_RDX;
  long in_RSI;
  ASMState *in_RDI;
  Reg dest;
  int32_t ofs;
  int hiop;
  RegSet drop;
  undefined4 in_stack_ffffffffffffffd8;
  RegSet in_stack_ffffffffffffffdc;
  undefined4 uVar2;
  uint uVar3;
  
  uVar3 = 0xffff0fc7;
  uVar2 = 0;
  if ((*(uint *)(in_RDX + 8) & 0x400) != 0) {
    uVar3 = 0xfc7;
  }
  if ((*(byte *)(in_RSI + 6) & 0x80) == 0) {
    uVar3 = (1 << (*(byte *)(in_RSI + 6) & 0x1f) ^ 0xffffffffU) & uVar3;
  }
  ra_evictset((ASMState *)((ulong)uVar3 << 0x20),in_stack_ffffffffffffffdc);
  if (((*(byte *)(in_RSI + 6) & 0x80) == 0) || (*(char *)(in_RSI + 7) != '\0')) {
    if (((*(byte *)(in_RSI + 4) & 0x1f) == 0xe) || ((*(byte *)(in_RSI + 4) & 0x1f) == 0xd)) {
      ofs_00 = (uint)*(byte *)(in_RSI + 7) << 2;
      if ((*(uint *)(in_RDX + 8) & 0x200) == 0) {
        ra_destreg((ASMState *)CONCAT44(uVar3,uVar2),
                   (IRIns *)CONCAT44(ofs_00,in_stack_ffffffffffffffd8),0);
      }
      else {
        bVar1 = *(byte *)(in_RSI + 6);
        if ((bVar1 & 0x80) == 0) {
          in_RDI->freeset = 1 << (bVar1 & 0x1f) | in_RDI->freeset;
          in_RDI->modset = 1 << (bVar1 & 0x1f) | in_RDI->modset;
          emit_rr(in_RDI,XO_MOVD,bVar1 | 0x80200,0);
        }
        if (ofs_00 != 0) {
          emit_rmro(in_RDI,XO_MOVto,0x80200,4,ofs_00);
        }
      }
    }
    else {
      ra_destreg((ASMState *)CONCAT44(uVar3,uVar2),
                 (IRIns *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    }
  }
  return;
}

Assistant:

static void asm_setupresult(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  RegSet drop = RSET_SCRATCH;
  int hiop = (LJ_32 && (ir+1)->o == IR_HIOP && !irt_isnil((ir+1)->t));
  if ((ci->flags & CCI_NOFPRCLOBBER))
    drop &= ~RSET_FPR;
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  if (hiop && ra_hasreg((ir+1)->r))
    rset_clear(drop, (ir+1)->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);  /* Evictions must be performed first. */
  if (ra_used(ir)) {
    if (irt_isfp(ir->t)) {
      int32_t ofs = sps_scale(ir->s);  /* Use spill slot or temp slots. */
#if LJ_64
      if ((ci->flags & CCI_CASTU64)) {
	Reg dest = ir->r;
	if (ra_hasreg(dest)) {
	  ra_free(as, dest);
	  ra_modified(as, dest);
	  emit_rr(as, XO_MOVD, dest|REX_64, RID_RET);  /* Really MOVQ. */
	}
	if (ofs) emit_movtomro(as, RID_RET|REX_64, RID_ESP, ofs);
      } else {
	ra_destreg(as, ir, RID_FPRET);
      }
#else
      /* Number result is in x87 st0 for x86 calling convention. */
      Reg dest = ir->r;
      if (ra_hasreg(dest)) {
	ra_free(as, dest);
	ra_modified(as, dest);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSD : XO_MOVSS,
		  dest, RID_ESP, ofs);
      }
      if ((ci->flags & CCI_CASTU64)) {
	emit_movtomro(as, RID_RETLO, RID_ESP, ofs);
	emit_movtomro(as, RID_RETHI, RID_ESP, ofs+4);
      } else {
	emit_rmro(as, irt_isnum(ir->t) ? XO_FSTPq : XO_FSTPd,
		  irt_isnum(ir->t) ? XOg_FSTPq : XOg_FSTPd, RID_ESP, ofs);
      }
#endif
#if LJ_32
    } else if (hiop) {
      ra_destpair(as, ir);
#endif
    } else {
      lj_assertA(!irt_ispri(ir->t), "PRI dest");
      ra_destreg(as, ir, RID_RET);
    }
  } else if (LJ_32 && irt_isfp(ir->t) && !(ci->flags & CCI_CASTU64)) {
    emit_x87op(as, XI_FPOP);  /* Pop unused result from x87 st0. */
  }
}